

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ber_tlv_tag.c
# Opt level: O2

ssize_t ber_fetch_tag(void *ptr,size_t size,ber_tlv_tag_t *tag_r)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  
  if (size != 0) {
    uVar2 = *ptr & 0x1f;
    if (uVar2 != 0x1f) {
      uVar2 = uVar2 << 2;
      uVar3 = 1;
LAB_0014911d:
      *tag_r = *ptr >> 6 | uVar2;
      return uVar3;
    }
    uVar2 = 0;
    for (uVar3 = 2; uVar3 <= size; uVar3 = uVar3 + 1) {
      bVar1 = *(byte *)((long)ptr + (uVar3 - 1));
      if (-1 < (char)bVar1) {
        uVar2 = uVar2 * 0x200 + (uint)bVar1 * 4;
        goto LAB_0014911d;
      }
      if (0x7fffff < uVar2 << 7) {
        return -1;
      }
      uVar2 = uVar2 << 7 | bVar1 & 0x7f;
    }
  }
  return 0;
}

Assistant:

ssize_t
ber_fetch_tag(const void *ptr, size_t size, ber_tlv_tag_t *tag_r) {
	ber_tlv_tag_t val;
	ber_tlv_tag_t tclass;
	size_t skipped;

	if(size == 0)
		return 0;

	val = *(const uint8_t *)ptr;
	tclass = (val >> 6);
	if((val &= 0x1F) != 0x1F) {
		/*
		 * Simple form: everything encoded in a single octet.
		 * Tag Class is encoded using two least significant bits.
		 */
		*tag_r = (val << 2) | tclass;
		return 1;
	}

	/*
	 * Each octet contains 7 bits of useful information.
	 * The MSB is 0 if it is the last octet of the tag.
	 */
	for(val = 0, ptr = ((const char *)ptr) + 1, skipped = 2;
			skipped <= size;
				ptr = ((const char *)ptr) + 1, skipped++) {
		unsigned int oct = *(const uint8_t *)ptr;
		if(oct & 0x80) {
			val = (val << 7) | (oct & 0x7F);
			/*
			 * Make sure there are at least 9 bits spare
			 * at the MS side of a value.
			 */
			if(val >> ((8 * sizeof(val)) - 9)) {
				/*
				 * We would not be able to accomodate
				 * any more tag bits.
				 */
				return -1;
			}
		} else {
			val = (val << 7) | oct;
			*tag_r = (val << 2) | tclass;
			return skipped;
		}
	}

	return 0;	/* Want more */
}